

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVR3File.cpp
# Opt level: O1

void __thiscall BVR3File::BVR3File(BVR3File *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  string *psVar2;
  pointer *pppcVar3;
  pointer __src;
  iterator __position;
  pointer pBVar4;
  double dVar5;
  size_t __size;
  bool bVar6;
  _List_node_base **pp_Var7;
  BVR3File *pBVar8;
  value_type vVar9;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  _List_node_base *p_Var10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> __position_00;
  value_type vVar16;
  long *plVar17;
  BRDPoint *pBVar18;
  int iVar19;
  _List_node_base *p_Var20;
  ulong *puVar21;
  BRDPoint BVar22;
  long *plVar23;
  size_type *psVar24;
  int iVar25;
  size_t __n;
  ulong uVar26;
  _List_node_base *p_Var27;
  _List_node_base *p_Var28;
  int iVar29;
  pointer ppcVar30;
  int iVar31;
  int iVar32;
  _List_node_base *p_Var33;
  _List_node_base *p_Var34;
  char *pold;
  _List_node_base *p_Var35;
  _List_node_base *p_Var36;
  char *p;
  char *s;
  BRDPoint end_point;
  value_type first_outline_segment;
  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
  outline_segments;
  char *arena;
  vector<char_*,_std::allocator<char_*>_> lines;
  BRDPoint start_point;
  char *arena_end;
  BRDPart part;
  BRDPart blank_part;
  _List_node_base *local_220;
  _List_node_base *local_218;
  value_type local_210;
  anon_class_32_4_fa413470 local_208;
  _List_node_base local_1e8;
  _List_node_base local_1d8;
  pointer *local_1c8;
  long local_1c0;
  pointer local_1b8 [2];
  vector<char_*,_std::allocator<char_*>_> local_1a8;
  long lStack_190;
  BVR3File *local_180;
  value_type local_178;
  char *local_170;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  undefined8 local_158;
  BRDPoint BStack_150;
  double local_148;
  long *plStack_140;
  char *pcStack_138;
  BRDPoint local_128;
  BRDPoint BStack_120;
  undefined8 local_118;
  BRDPoint BStack_110;
  long *local_108;
  char *pcStack_100;
  long local_f8 [2];
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  undefined8 local_c0;
  uint uStack_b8;
  int iStack_b4;
  int iStack_b0;
  BRDPoint BStack_ac;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *local_a0;
  long *local_98;
  ulong *local_90;
  long local_88;
  ulong auStack_80 [2];
  ulong local_70;
  uint uStack_68;
  int iStack_64;
  int iStack_60;
  BRDPoint BStack_5c;
  vector<BRDPin,std::allocator<BRDPin>> *local_50;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_48;
  char *local_40;
  pointer local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022e3a0;
  uVar26 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_40 = setlocale(1,"C");
  local_180 = this;
  if (4 < uVar26) {
    __size = (uVar26 + 1) * 3;
    pcVar15 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar15;
    if (pcVar15 != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar15,__src,__n);
      }
      pcVar15[uVar26] = '\0';
      local_1c8 = (pointer *)(pcVar15 + uVar26 + 1);
      local_170 = pcVar15 + (__size - 1);
      pcVar15[__size - 1] = '\0';
      local_90 = auStack_80;
      local_98 = (long *)0x0;
      local_88 = 0;
      auStack_80[0] = auStack_80[0] & 0xffffffffffffff00;
      local_70 = 0;
      uStack_68 = 0;
      iStack_64 = 0;
      iStack_60 = 0;
      BStack_5c.x = 0;
      BStack_5c.y = 0;
      local_128.x = 0;
      local_128.y = 0;
      BStack_120.x = 0;
      BStack_120.y = 0;
      local_118 = (ulong)local_118._4_4_ << 0x20;
      local_108 = (long *)0x0;
      pcStack_100 = (char *)0x0;
      local_e0._M_p = (pointer)&aStack_d0;
      local_e8 = (undefined1  [8])0x0;
      local_d8 = 0;
      aStack_d0._M_allocated_capacity = aStack_d0._M_allocated_capacity & 0xffffffffffffff00;
      local_c0 = 0;
      uStack_b8 = 0;
      iStack_b4 = 0;
      iStack_b0 = 0;
      BStack_ac.x = 0;
      BStack_ac.y = 0;
      local_158 = (ulong)local_158._4_4_ << 0x20;
      local_168._0_4_ = 0;
      local_168._4_4_ = 0;
      uStack_160._0_4_ = 0;
      uStack_160._4_4_ = 0;
      BStack_150 = (BRDPoint)0x1ed23f;
      local_148 = 0.5;
      plStack_140 = (long *)0x0;
      pcStack_138 = (char *)0x0;
      local_1e8._M_next = &local_1e8;
      local_1d8._M_next = (_List_node_base *)0x0;
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1e8._M_prev = local_1e8._M_next;
      stringfile(pcVar15,&local_1a8);
      local_38 = local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_a0 = &(local_180->super_BRDFileBase).format;
        local_48 = &(local_180->super_BRDFileBase).parts;
        local_50 = (vector<BRDPin,std::allocator<BRDPin>> *)&(local_180->super_BRDFileBase).pins;
        ppcVar30 = local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          pcVar15 = *ppcVar30;
          p_Var20 = (_List_node_base *)(pcVar15 + 0xb);
          p_Var28 = (_List_node_base *)(pcVar15 + 10);
          p_Var10 = (_List_node_base *)(pcVar15 + 0xc);
          p_Var36 = (_List_node_base *)(pcVar15 + 0x11);
          do {
            p_Var35 = p_Var36;
            p_Var27 = p_Var10;
            p_Var34 = p_Var28;
            p_Var33 = p_Var20;
            bVar11 = *(byte *)((long)&p_Var35[-2]._M_prev + 7);
            iVar12 = isspace((uint)bVar11);
            p_Var36 = (_List_node_base *)((long)&p_Var35->_M_next + 1);
            p_Var20 = (_List_node_base *)((long)&p_Var33->_M_next + 1);
            p_Var28 = (_List_node_base *)((long)&p_Var34->_M_next + 1);
            p_Var10 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
          } while (iVar12 != 0);
          if (bVar11 != 0) {
            p_Var20 = (_List_node_base *)((long)&p_Var35[-2]._M_prev + 7);
            local_220 = p_Var20;
            iVar12 = strncmp((char *)p_Var20,"PART_NAME ",10);
            if (iVar12 == 0) {
              p_Var20 = (_List_node_base *)((long)&p_Var35[-1]._M_prev + 1);
              bVar11 = *(byte *)((long)&p_Var35[-1]._M_prev + 1);
              local_220 = p_Var20;
              if (bVar11 != 0) {
                do {
                  p_Var20 = p_Var33;
                  iVar12 = isspace((uint)bVar11);
                  p_Var33 = p_Var20;
                  if (iVar12 == 0) break;
                  bVar11 = *(byte *)&p_Var20->_M_next;
                  p_Var33 = (_List_node_base *)((long)&p_Var20->_M_next + 1);
                  local_220 = p_Var20;
                } while (bVar11 != 0);
                p_Var20 = (_List_node_base *)((long)&p_Var33[-1]._M_prev + 7);
              }
              bVar11 = *(byte *)&local_220->_M_next;
              p_Var28 = local_220;
              local_218 = p_Var20;
              if (bVar11 != 0) {
                p_Var20 = (_List_node_base *)((long)&local_220->_M_next + 1);
                do {
                  p_Var28 = p_Var20;
                  iVar12 = isspace((uint)bVar11);
                  p_Var20 = p_Var28;
                  if (iVar12 != 0) break;
                  bVar11 = *(byte *)&p_Var28->_M_next;
                  p_Var20 = (_List_node_base *)((long)&p_Var28->_M_next + 1);
                  local_220 = p_Var28;
                } while (bVar11 != 0);
                p_Var28 = (_List_node_base *)((long)&p_Var20[-1]._M_prev + 7);
              }
              *(char *)&p_Var28->_M_next = '\0';
              local_220 = (_List_node_base *)((long)&local_220->_M_next + 1);
              local_e8 = (undefined1  [8])
                         fix_to_utf8((char *)local_218,(char **)&local_1c8,local_170);
            }
            else {
              iVar12 = strncmp((char *)p_Var20,"PART_SIDE ",10);
              if (iVar12 == 0) {
                p_Var20 = (_List_node_base *)((long)&p_Var35[-1]._M_prev + 1);
                bVar11 = *(byte *)((long)&p_Var35[-1]._M_prev + 1);
                local_220 = p_Var20;
                if (bVar11 != 0) {
                  do {
                    p_Var20 = p_Var33;
                    iVar12 = isspace((uint)bVar11);
                    p_Var33 = p_Var20;
                    if (iVar12 == 0) break;
                    bVar11 = *(byte *)&p_Var20->_M_next;
                    p_Var33 = (_List_node_base *)((long)&p_Var20->_M_next + 1);
                    local_220 = p_Var20;
                  } while (bVar11 != 0);
                  p_Var20 = (_List_node_base *)((long)&p_Var33[-1]._M_prev + 7);
                }
                bVar11 = *(byte *)&local_220->_M_next;
                p_Var28 = local_220;
                local_218 = p_Var20;
                if (bVar11 != 0) {
                  p_Var20 = (_List_node_base *)((long)&local_220->_M_next + 1);
                  do {
                    p_Var28 = p_Var20;
                    iVar12 = isspace((uint)bVar11);
                    p_Var20 = p_Var28;
                    if (iVar12 != 0) break;
                    bVar11 = *(byte *)&p_Var28->_M_next;
                    p_Var20 = (_List_node_base *)((long)&p_Var28->_M_next + 1);
                    local_220 = p_Var28;
                  } while (bVar11 != 0);
                  p_Var28 = (_List_node_base *)((long)&p_Var20[-1]._M_prev + 7);
                }
                *(char *)&p_Var28->_M_next = '\0';
                local_220 = (_List_node_base *)((long)&local_220->_M_next + 1);
                pcVar15 = fix_to_utf8((char *)local_218,(char **)&local_1c8,local_170);
                iVar12 = strcmp(pcVar15,"T");
                if (iVar12 == 0) {
                  local_c0 = CONCAT44(local_c0._4_4_,2);
                }
                else {
                  iVar12 = strcmp(pcVar15,"B");
                  if (iVar12 == 0) {
                    local_c0 = CONCAT44(local_c0._4_4_,1);
                  }
                  else {
                    iVar12 = strcmp(pcVar15,"O");
                    if (iVar12 == 0) {
                      local_c0 = local_c0 & 0xffffffff00000000;
                    }
                  }
                }
              }
              else {
                iVar12 = strncmp((char *)p_Var20,"PART_ORIGIN ",0xc);
                if (iVar12 != 0) {
                  iVar12 = strncmp((char *)p_Var20,"PART_MOUNT ",0xb);
                  if (iVar12 == 0) {
                    p_Var20 = (_List_node_base *)((long)&p_Var35[-1]._M_prev + 2);
                    bVar11 = *(byte *)((long)&p_Var35[-1]._M_prev + 2);
                    local_220 = p_Var20;
                    if (bVar11 != 0) {
                      do {
                        p_Var20 = p_Var27;
                        iVar12 = isspace((uint)bVar11);
                        p_Var27 = p_Var20;
                        if (iVar12 == 0) break;
                        bVar11 = *(byte *)&p_Var20->_M_next;
                        p_Var27 = (_List_node_base *)((long)&p_Var20->_M_next + 1);
                        local_220 = p_Var20;
                      } while (bVar11 != 0);
                      p_Var20 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                    }
                    bVar11 = *(byte *)&local_220->_M_next;
                    p_Var28 = local_220;
                    local_218 = p_Var20;
                    if (bVar11 != 0) {
                      p_Var20 = (_List_node_base *)((long)&local_220->_M_next + 1);
                      do {
                        p_Var28 = p_Var20;
                        iVar12 = isspace((uint)bVar11);
                        p_Var20 = p_Var28;
                        if (iVar12 != 0) break;
                        bVar11 = *(byte *)&p_Var28->_M_next;
                        p_Var20 = (_List_node_base *)((long)&p_Var28->_M_next + 1);
                        local_220 = p_Var28;
                      } while (bVar11 != 0);
                      p_Var28 = (_List_node_base *)((long)&p_Var20[-1]._M_prev + 7);
                    }
                    *(char *)&p_Var28->_M_next = '\0';
                    local_220 = (_List_node_base *)((long)&local_220->_M_next + 1);
                    pcVar15 = fix_to_utf8((char *)local_218,(char **)&local_1c8,local_170);
                    iVar12 = strcmp(pcVar15,"SMD");
                    if (iVar12 == 0) {
                      local_c0 = local_c0 & 0xffffffff;
                    }
                    else {
                      local_c0 = CONCAT44(1,(BRDPartMountingSide)local_c0);
                    }
                  }
                  else {
                    iVar12 = strncmp((char *)p_Var20,"PART_OUTLINE_RELATIVE ",0x16);
                    if ((iVar12 != 0) &&
                       (iVar12 = strncmp((char *)p_Var20,"PIN_ID ",7), iVar12 != 0)) {
                      iVar12 = strncmp((char *)p_Var20,"PIN_NUMBER ",0xb);
                      if (iVar12 == 0) {
                        p_Var20 = (_List_node_base *)((long)&p_Var35[-1]._M_prev + 2);
                        bVar11 = *(byte *)((long)&p_Var35[-1]._M_prev + 2);
                        local_220 = p_Var20;
                        if (bVar11 != 0) {
                          do {
                            p_Var20 = p_Var27;
                            iVar12 = isspace((uint)bVar11);
                            p_Var27 = p_Var20;
                            if (iVar12 == 0) break;
                            bVar11 = *(byte *)&p_Var20->_M_next;
                            p_Var27 = (_List_node_base *)((long)&p_Var20->_M_next + 1);
                            local_220 = p_Var20;
                          } while (bVar11 != 0);
                          p_Var20 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                        }
                        bVar11 = *(byte *)&local_220->_M_next;
                        p_Var28 = local_220;
                        local_218 = p_Var20;
                        if (bVar11 != 0) {
                          p_Var20 = (_List_node_base *)((long)&local_220->_M_next + 1);
                          do {
                            p_Var28 = p_Var20;
                            iVar12 = isspace((uint)bVar11);
                            p_Var20 = p_Var28;
                            if (iVar12 != 0) break;
                            bVar11 = *(byte *)&p_Var28->_M_next;
                            p_Var20 = (_List_node_base *)((long)&p_Var28->_M_next + 1);
                            local_220 = p_Var28;
                          } while (bVar11 != 0);
                          p_Var28 = (_List_node_base *)((long)&p_Var20[-1]._M_prev + 7);
                        }
                        *(char *)&p_Var28->_M_next = '\0';
                        local_220 = (_List_node_base *)((long)&local_220->_M_next + 1);
                        plStack_140 = (long *)fix_to_utf8((char *)local_218,(char **)&local_1c8,
                                                          local_170);
                      }
                      else {
                        iVar12 = strncmp((char *)p_Var20,"PIN_NAME ",9);
                        if (iVar12 == 0) {
                          p_Var20 = (_List_node_base *)&p_Var35[-1]._M_prev;
                          bVar11 = *(byte *)&p_Var35[-1]._M_prev;
                          local_220 = p_Var20;
                          if (bVar11 != 0) {
                            do {
                              p_Var20 = p_Var34;
                              iVar12 = isspace((uint)bVar11);
                              p_Var34 = p_Var20;
                              if (iVar12 == 0) break;
                              bVar11 = *(byte *)&p_Var20->_M_next;
                              p_Var34 = (_List_node_base *)((long)&p_Var20->_M_next + 1);
                              local_220 = p_Var20;
                            } while (bVar11 != 0);
                            p_Var20 = (_List_node_base *)((long)&p_Var34[-1]._M_prev + 7);
                          }
                          bVar11 = *(byte *)&local_220->_M_next;
                          p_Var28 = local_220;
                          local_218 = p_Var20;
                          if (bVar11 != 0) {
                            p_Var20 = (_List_node_base *)((long)&local_220->_M_next + 1);
                            do {
                              p_Var28 = p_Var20;
                              iVar12 = isspace((uint)bVar11);
                              p_Var20 = p_Var28;
                              if (iVar12 != 0) break;
                              bVar11 = *(byte *)&p_Var28->_M_next;
                              p_Var20 = (_List_node_base *)((long)&p_Var28->_M_next + 1);
                              local_220 = p_Var28;
                            } while (bVar11 != 0);
                            p_Var28 = (_List_node_base *)((long)&p_Var20[-1]._M_prev + 7);
                          }
                          *(char *)&p_Var28->_M_next = '\0';
                          local_220 = (_List_node_base *)((long)&local_220->_M_next + 1);
                          pcStack_138 = fix_to_utf8((char *)local_218,(char **)&local_1c8,local_170)
                          ;
                        }
                        else {
                          iVar12 = strncmp((char *)p_Var20,"PIN_SIDE ",9);
                          if (iVar12 == 0) {
                            p_Var20 = (_List_node_base *)&p_Var35[-1]._M_prev;
                            bVar11 = *(byte *)&p_Var35[-1]._M_prev;
                            local_220 = p_Var20;
                            if (bVar11 != 0) {
                              do {
                                p_Var20 = p_Var34;
                                iVar12 = isspace((uint)bVar11);
                                p_Var34 = p_Var20;
                                if (iVar12 == 0) break;
                                bVar11 = *(byte *)&p_Var20->_M_next;
                                p_Var34 = (_List_node_base *)((long)&p_Var20->_M_next + 1);
                                local_220 = p_Var20;
                              } while (bVar11 != 0);
                              p_Var20 = (_List_node_base *)((long)&p_Var34[-1]._M_prev + 7);
                            }
                            bVar11 = *(byte *)&local_220->_M_next;
                            p_Var28 = local_220;
                            local_218 = p_Var20;
                            if (bVar11 != 0) {
                              p_Var20 = (_List_node_base *)((long)&local_220->_M_next + 1);
                              do {
                                p_Var28 = p_Var20;
                                iVar12 = isspace((uint)bVar11);
                                p_Var20 = p_Var28;
                                if (iVar12 != 0) break;
                                bVar11 = *(byte *)&p_Var28->_M_next;
                                p_Var20 = (_List_node_base *)((long)&p_Var28->_M_next + 1);
                                local_220 = p_Var28;
                              } while (bVar11 != 0);
                              p_Var28 = (_List_node_base *)((long)&p_Var20[-1]._M_prev + 7);
                            }
                            *(char *)&p_Var28->_M_next = '\0';
                            local_220 = (_List_node_base *)((long)&local_220->_M_next + 1);
                            pcVar15 = fix_to_utf8((char *)local_218,(char **)&local_1c8,local_170);
                            iVar12 = strcmp(pcVar15,"T");
                            if (iVar12 == 0) {
                              local_158 = CONCAT44(local_158._4_4_,2);
                            }
                            else {
                              iVar12 = strcmp(pcVar15,"B");
                              if (iVar12 == 0) {
                                local_158 = CONCAT44(local_158._4_4_,1);
                              }
                              else {
                                iVar12 = strcmp(pcVar15,"O");
                                if (iVar12 == 0) {
                                  local_158 = local_158 & 0xffffffff00000000;
                                }
                              }
                            }
                          }
                          else {
                            iVar12 = strncmp((char *)p_Var20,"PIN_ORIGIN ",0xb);
                            if (iVar12 == 0) {
                              local_220 = (_List_node_base *)((long)&p_Var35[-1]._M_prev + 2);
                              dVar5 = strtod((char *)local_220,(char **)&local_220);
                              dVar5 = trunc(dVar5);
                              local_168._0_4_ = (int)dVar5;
                              dVar5 = strtod((char *)local_220,(char **)&local_220);
                              dVar5 = trunc(dVar5);
                              local_168._4_4_ = (int)dVar5;
                            }
                            else {
                              iVar12 = strncmp((char *)p_Var20,"PIN_RADIUS ",0xb);
                              if (iVar12 == 0) {
                                local_220 = (_List_node_base *)((long)&p_Var35[-1]._M_prev + 2);
                                local_148 = strtod((char *)local_220,(char **)&local_220);
                              }
                              else {
                                iVar12 = strncmp((char *)p_Var20,"PIN_NET ",8);
                                if (iVar12 == 0) {
                                  local_220 = (_List_node_base *)((long)&p_Var35[-1]._M_next + 7);
                                  local_208.p = (char **)&local_220;
                                  local_208.s = (char **)&local_218;
                                  local_208.arena = (char **)&local_1c8;
                                  local_208.arena_end = &local_170;
                                  BStack_150 = (BRDPoint)
                                               BVR3File::anon_class_32_4_fa413470::operator()
                                                         (&local_208);
                                }
                                else {
                                  iVar12 = strncmp((char *)p_Var20,"PIN_TYPE ",9);
                                  if (((iVar12 != 0) &&
                                      (iVar12 = strncmp((char *)p_Var20,"PIN_COMMENT ",0xc),
                                      iVar12 != 0)) &&
                                     (iVar12 = strncmp((char *)p_Var20,"PIN_OUTLINE_RELATIVE ",0x15)
                                     , iVar12 != 0)) {
                                    iVar12 = strcmp((char *)p_Var20,"PIN_END");
                                    if (iVar12 == 0) {
                                      uVar14 = (int)((ulong)((long)(local_180->super_BRDFileBase).
                                                                   parts.
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_180->super_BRDFileBase).parts.
                                                                                                                
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                               0x38e38e39 + 1;
                                      uStack_160._4_4_ = uVar14;
                                      __position._M_current =
                                           (local_180->super_BRDFileBase).pins.
                                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                           _M_impl.super__Vector_impl_data._M_finish;
                                      if (__position._M_current ==
                                          (local_180->super_BRDFileBase).pins.
                                          super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                        std::vector<BRDPin,std::allocator<BRDPin>>::
                                        _M_realloc_insert<BRDPin_const&>
                                                  (local_50,__position,(BRDPin *)local_168);
                                      }
                                      else {
                                        (__position._M_current)->name = pcStack_138;
                                        (__position._M_current)->radius = local_148;
                                        (__position._M_current)->snum = (char *)plStack_140;
                                        *(ulong *)&(__position._M_current)->side = local_158;
                                        (__position._M_current)->net = (char *)BStack_150;
                                        ((__position._M_current)->pos).x = local_168._0_4_;
                                        ((__position._M_current)->pos).y = local_168._4_4_;
                                        (__position._M_current)->probe = (int)uStack_160;
                                        (__position._M_current)->part = uVar14;
                                        ppBVar1 = &(local_180->super_BRDFileBase).pins.
                                                                                                      
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        *ppBVar1 = *ppBVar1 + 1;
                                      }
                                      local_158 = local_118;
                                      local_168 = (undefined1  [8])local_128;
                                      uStack_160._0_4_ = BStack_120.x;
                                      uStack_160._4_4_ = BStack_120.y;
                                      BStack_150 = (BRDPoint)0x1ed23f;
                                      local_148 = 0.5;
                                      plStack_140 = local_108;
                                      pcStack_138 = pcStack_100;
                                    }
                                    else {
                                      iVar12 = strcmp((char *)p_Var20,"PART_END");
                                      if (iVar12 == 0) {
                                        uStack_b8 = (int)((ulong)((long)(local_180->
                                                                        super_BRDFileBase).pins.
                                                                                                                                                
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_180->super_BRDFileBase).pins.
                                                                                                                
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                                  -0x49249249;
                                        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                                  (local_48,(value_type *)local_e8);
                                        local_e8 = (undefined1  [8])local_98;
                                        std::__cxx11::string::_M_assign((string *)&local_e0);
                                        local_c0 = local_70;
                                        BStack_ac = BStack_5c;
                                        iStack_b0 = iStack_60;
                                        uStack_b8 = uStack_68;
                                        iStack_b4 = iStack_64;
                                      }
                                      else {
                                        iVar12 = strncmp((char *)p_Var20,"OUTLINE_POINTS ",0xf);
                                        if (iVar12 == 0) {
                                          local_220 = (_List_node_base *)
                                                      ((long)&p_Var35[-1]._M_prev + 6);
                                          while (p_Var20 = local_220,
                                                *(char *)&local_220->_M_next != '\0') {
                                            local_208.p = (char **)0x0;
                                            dVar5 = strtod((char *)local_220,(char **)&local_220);
                                            dVar5 = trunc(dVar5);
                                            local_208.p = (char **)CONCAT44(local_208.p._4_4_,
                                                                            (int)dVar5);
                                            dVar5 = strtod((char *)local_220,(char **)&local_220);
                                            dVar5 = trunc(dVar5);
                                            p_Var28 = local_220;
                                            local_208.p = (char **)CONCAT44((int)dVar5,
                                                                            (int)local_208.p);
                                            if ((p_Var20 == local_220) ||
                                               (std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back(local_a0,(value_type *)&local_208),
                                               p_Var20 == p_Var28)) break;
                                          }
                                        }
                                        else {
                                          iVar12 = strncmp((char *)p_Var20,"OUTLINE_SEGMENTED ",0x12
                                                          );
                                          if (iVar12 == 0) {
                                            local_220 = p_Var36;
                                            while (p_Var20 = local_220,
                                                  *(char *)&local_220->_M_next != '\0') {
                                              local_208.p = (char **)0x0;
                                              local_208.s = (char **)0x0;
                                              dVar5 = strtod((char *)local_220,(char **)&local_220);
                                              dVar5 = trunc(dVar5);
                                              local_208.p = (char **)CONCAT44(local_208.p._4_4_,
                                                                              (int)dVar5);
                                              dVar5 = strtod((char *)local_220,(char **)&local_220);
                                              dVar5 = trunc(dVar5);
                                              local_208.p = (char **)CONCAT44((int)dVar5,
                                                                              (int)local_208.p);
                                              dVar5 = strtod((char *)local_220,(char **)&local_220);
                                              dVar5 = trunc(dVar5);
                                              local_208.s = (char **)CONCAT44(local_208.s._4_4_,
                                                                              (int)dVar5);
                                              dVar5 = strtod((char *)local_220,(char **)&local_220);
                                              dVar5 = trunc(dVar5);
                                              p_Var28 = local_220;
                                              local_208.s = (char **)CONCAT44((int)dVar5,
                                                                              (int)local_208.s);
                                              if ((p_Var20 == local_220) ||
                                                 (std::__cxx11::
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::push_back((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)&local_1e8,(value_type *)&local_208),
                                                 p_Var20 == p_Var28)) break;
                                            }
                                            if (local_1e8._M_next != &local_1e8) {
                                              local_208.p = (char **)local_1e8._M_next[1]._M_next;
                                              local_208.s = (char **)local_1e8._M_next[1]._M_prev;
                                              std::__cxx11::
                                              list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                              ::pop_front((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)&local_1e8);
                                              this_00 = local_a0;
                                              std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                              push_back(local_a0,(value_type *)&local_208);
                                              std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                              push_back(this_00,(value_type *)&local_208.s);
                                              local_178 = (value_type)local_208.p;
                                              vVar9 = local_178;
                                              local_210 = (value_type)local_208.s;
                                              vVar16 = local_210;
                                              local_210.y = (int)((ulong)local_208.s >> 0x20);
                                              local_178.y = (int)((ulong)local_208.p >> 0x20);
                                              bVar6 = local_178.y != local_210.y;
                                              __position_00._M_node = local_1e8._M_next;
                                              iVar12 = local_210.y;
                                              local_210 = vVar16;
                                              local_178 = vVar9;
                                              if (local_1e8._M_next != &local_1e8 &&
                                                  (bVar6 || (int)local_208.p != (int)local_208.s)) {
LAB_0014107f:
                                                do {
                                                  if ((vVar16.x ==
                                                       *(int *)&__position_00._M_node[1]._M_next) &&
                                                     (iVar12 == *(int *)((long)&__position_00.
                                                                                _M_node[1]._M_next +
                                                                        4))) {
                                                    p_Var20 = (_List_node_base *)
                                                              &__position_00._M_node[1]._M_prev;
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back(this_00,(value_type *)p_Var20);
LAB_0014118c:
                                                    local_210 = (value_type)p_Var20->_M_next;
                                                  }
                                                  else {
                                                    if ((vVar16.x ==
                                                         *(int *)&__position_00._M_node[1]._M_prev)
                                                       && (iVar12 == *(int *)((long)&__position_00.
                                                                                     _M_node[1].
                                                                                     _M_prev + 4)))
                                                    {
                                                      p_Var20 = __position_00._M_node + 1;
                                                      std::
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back(this_00,(value_type *)p_Var20);
                                                  goto LAB_0014118c;
                                                  }
                                                  pp_Var7 = &(__position_00._M_node)->_M_next;
                                                  __position_00._M_node = *pp_Var7;
                                                  if (*pp_Var7 != &local_1e8) goto LAB_0014107f;
                                                  __position_00 =
                                                       std::
                                                  min_element<std::_List_iterator<std::pair<BRDPoint,BRDPoint>>,BVR3File::BVR3File(std::vector<char,std::allocator<char>>&)::__0>
                                                            (local_1e8._M_next,&local_1e8,&local_210
                                                            );
                                                  iVar13 = local_210.x - local_178.x;
                                                  iVar12 = -iVar13;
                                                  if (0 < iVar13) {
                                                    iVar12 = iVar13;
                                                  }
                                                  iVar31 = local_210.y - local_178.y;
                                                  iVar13 = -iVar31;
                                                  if (0 < iVar31) {
                                                    iVar13 = iVar31;
                                                  }
                                                  iVar29 = local_210.x -
                                                           *(int *)&__position_00._M_node[1]._M_next
                                                  ;
                                                  iVar31 = -iVar29;
                                                  if (0 < iVar29) {
                                                    iVar31 = iVar29;
                                                  }
                                                  iVar32 = local_210.y -
                                                           *(int *)((long)&__position_00._M_node[1].
                                                                           _M_next + 4);
                                                  iVar29 = -iVar32;
                                                  if (0 < iVar32) {
                                                    iVar29 = iVar32;
                                                  }
                                                  iVar19 = local_210.x -
                                                           *(int *)&__position_00._M_node[1]._M_prev
                                                  ;
                                                  iVar32 = -iVar19;
                                                  if (0 < iVar19) {
                                                    iVar32 = iVar19;
                                                  }
                                                  iVar25 = local_210.y -
                                                           *(int *)((long)&__position_00._M_node[1].
                                                                           _M_prev + 4);
                                                  iVar19 = -iVar25;
                                                  if (0 < iVar25) {
                                                    iVar19 = iVar25;
                                                  }
                                                  if (((uint)(iVar13 + iVar12) <=
                                                       (uint)(iVar29 + iVar31)) &&
                                                     ((uint)(iVar13 + iVar12) <=
                                                      (uint)(iVar19 + iVar32))) {
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back(this_00,&local_178);
                                                    local_210 = local_178;
                                                    break;
                                                  }
                                                  p_Var28 = __position_00._M_node + 1;
                                                  p_Var20 = (_List_node_base *)
                                                            &__position_00._M_node[1]._M_prev;
                                                  if ((uint)(iVar29 + iVar31) <=
                                                      (uint)(iVar19 + iVar32)) {
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back(this_00,(value_type *)p_Var28);
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back(this_00,(value_type *)p_Var20);
                                                    goto LAB_0014118c;
                                                  }
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back(this_00,(value_type *)p_Var20);
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back(this_00,(value_type *)p_Var28);
                                                  local_210 = (value_type)p_Var28->_M_next;
                                                  }
                                                  std::__cxx11::
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::erase((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)&local_1e8,(const_iterator)__position_00._M_node
                                                  );
                                                  vVar16 = (value_type)
                                                           ((ulong)local_210 & 0xffffffff);
                                                  if ((local_178.y == local_210.y &&
                                                       local_178.x == local_210.x) ||
                                                     (__position_00._M_node = local_1e8._M_next,
                                                     iVar12 = local_210.y,
                                                     local_1e8._M_next == &local_1e8)) break;
                                                } while( true );
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          ppcVar30 = ppcVar30 + 1;
        } while (ppcVar30 != local_38);
      }
      pBVar8 = local_180;
      pBVar4 = (local_180->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (local_180->super_BRDFileBase).num_parts =
           (int)((ulong)((long)(local_180->super_BRDFileBase).parts.
                               super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_180->super_BRDFileBase).parts.
                              super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      (local_180->super_BRDFileBase).num_pins =
           (int)((ulong)((long)(local_180->super_BRDFileBase).pins.
                               super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_180->super_BRDFileBase).pins.
                              super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      (local_180->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar4 -
                         (long)(local_180->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (local_180->super_BRDFileBase).num_nails =
           (int)((ulong)((long)(local_180->super_BRDFileBase).nails.
                               super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_180->super_BRDFileBase).nails.
                              super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      setlocale(1,local_40);
      (pBVar8->super_BRDFileBase).valid =
           (pBVar8->super_BRDFileBase).num_format != 0 || (pBVar8->super_BRDFileBase).num_parts != 0
      ;
      if (local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var20 = local_1e8._M_next;
      while (p_Var20 != &local_1e8) {
        p_Var28 = (((_List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                     *)&p_Var20->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var20,0x20);
        p_Var20 = p_Var28;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &aStack_d0) {
        operator_delete(local_e0._M_p,aStack_d0._M_allocated_capacity + 1);
      }
      if (local_90 == auStack_80) {
        return;
      }
      operator_delete(local_90,auStack_80[0] + 1);
      return;
    }
    local_108 = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVR3File.cpp"
               ,"");
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_108);
    pppcVar3 = &local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    puVar21 = (ulong *)(plVar17 + 2);
    if ((pointer *)*plVar17 == (pointer *)puVar21) {
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*puVar21;
      lStack_190 = plVar17[3];
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pppcVar3;
    }
    else {
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*puVar21;
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar17;
    }
    local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar17[1];
    *plVar17 = (long)puVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    local_1c8 = local_1b8;
    std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x02');
    *(undefined2 *)local_1c8 = 0x3832;
    ppcVar30 = (pointer)0xf;
    if ((pointer *)
        local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start != pppcVar3) {
      ppcVar30 = local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    }
    if (ppcVar30 <
        (pointer)(local_1c0 +
                 (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish)) {
      ppcVar30 = (pointer)0xf;
      if (local_1c8 != local_1b8) {
        ppcVar30 = local_1b8[0];
      }
      if ((pointer)(local_1c0 +
                   (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_finish) <= ppcVar30) {
        plVar17 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_1c8,0,(char *)0x0,
                                     (ulong)local_1a8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
        goto LAB_00141fcc;
      }
    }
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
LAB_00141fcc:
    local_1e8._M_next = &local_1d8;
    p_Var20 = (_List_node_base *)(plVar17 + 2);
    if ((_List_node_base *)*plVar17 == p_Var20) {
      local_1d8._M_next = p_Var20->_M_next;
      local_1d8._M_prev = (_List_node_base *)plVar17[3];
    }
    else {
      local_1d8._M_next = p_Var20->_M_next;
      local_1e8._M_next = (_List_node_base *)*plVar17;
    }
    local_1e8._M_prev = (_List_node_base *)plVar17[1];
    *plVar17 = (long)p_Var20;
    plVar17[1] = 0;
    *(undefined1 *)&p_Var20->_M_next = 0;
    pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1e8);
    BVar22 = (BRDPoint)(pBVar18 + 2);
    if (*pBVar18 == BVar22) {
      local_118 = *(ulong *)BVar22;
      BStack_110 = pBVar18[3];
      local_128 = (BRDPoint)&local_118;
    }
    else {
      local_118 = *(ulong *)BVar22;
      local_128 = *pBVar18;
    }
    BStack_120 = pBVar18[1];
    *pBVar18 = BVar22;
    pBVar18[1].x = 0;
    pBVar18[1].y = 0;
    *(undefined1 *)&pBVar18[2].x = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_128);
    local_208.p = (char **)&local_208.arena;
    plVar23 = plVar17 + 2;
    if ((char ***)*plVar17 == (char ***)plVar23) {
      local_208.arena = (char **)*plVar23;
      local_208.arena_end = (char **)plVar17[3];
    }
    else {
      local_208.arena = (char **)*plVar23;
      local_208.p = (char **)*plVar17;
    }
    local_208.s = (char **)plVar17[1];
    *plVar17 = (long)plVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_208);
    local_168 = (undefined1  [8])&local_158;
    BVar22 = (BRDPoint)(pBVar18 + 2);
    if (*pBVar18 == BVar22) {
      local_158 = *(ulong *)BVar22;
      BStack_150 = pBVar18[3];
    }
    else {
      local_158 = *(ulong *)BVar22;
      local_168 = (undefined1  [8])*pBVar18;
    }
    uStack_160 = pBVar18[1];
    *pBVar18 = BVar22;
    pBVar18[1].x = 0;
    pBVar18[1].y = 0;
    *(undefined1 *)&pBVar18[2].x = 0;
    plVar17 = (long *)std::__cxx11::string::append(local_168);
    psVar24 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar24) {
      local_d8 = *psVar24;
      aStack_d0._M_allocated_capacity = plVar17[3];
      local_e8 = (undefined1  [8])&local_d8;
    }
    else {
      local_d8 = *psVar24;
      local_e8 = (undefined1  [8])*plVar17;
    }
    local_e0._M_p = (pointer)plVar17[1];
    *plVar17 = (long)psVar24;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append(local_e8);
    plVar23 = plVar17 + 2;
    if ((long *)*plVar17 == plVar23) {
      local_88 = *plVar23;
      auStack_80[0] = plVar17[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar23;
      local_98 = (long *)*plVar17;
    }
    local_90 = (ulong *)plVar17[1];
    *plVar17 = (long)plVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar2 = &(local_180->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar2,(string *)&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,local_d8 + 1);
    }
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158 + 1);
    }
    if ((char ***)local_208.p != &local_208.arena) {
      operator_delete(local_208.p,(long)local_208.arena + 1);
    }
    if (local_128 != (BRDPoint)&local_118) {
      operator_delete((void *)local_128,local_118 + 1);
    }
    if (local_1e8._M_next != &local_1d8) {
      operator_delete(local_1e8._M_next,(ulong)((long)&(local_1d8._M_next)->_M_next + 1));
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,(long)local_1b8[0] + 1);
    }
    if ((pointer *)
        local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
    SDL_LogError(1,"%s",(psVar2->_M_dataplus)._M_p);
    return;
  }
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVR3File.cpp"
             ,"");
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_108);
  pppcVar3 = &local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  puVar21 = (ulong *)(plVar17 + 2);
  if ((pointer *)*plVar17 == (pointer *)puVar21) {
    local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar21;
    lStack_190 = plVar17[3];
    local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)pppcVar3;
  }
  else {
    local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar21;
    local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar17;
  }
  local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar17[1];
  *plVar17 = (long)puVar21;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x02');
  *(undefined2 *)local_1c8 = 0x3532;
  ppcVar30 = (pointer)0xf;
  if ((pointer *)
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start != pppcVar3) {
    ppcVar30 = local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  }
  if (ppcVar30 <
      (pointer)(local_1c0 +
               (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
    ppcVar30 = (pointer)0xf;
    if (local_1c8 != local_1b8) {
      ppcVar30 = local_1b8[0];
    }
    if ((pointer)(local_1c0 +
                 (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish) <= ppcVar30) {
      plVar17 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_1c8,0,(char *)0x0,
                                   (ulong)local_1a8.
                                          super__Vector_base<char_*,_std::allocator<char_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
      goto LAB_00141b9e;
    }
  }
  plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
LAB_00141b9e:
  local_1e8._M_next = &local_1d8;
  p_Var20 = (_List_node_base *)(plVar17 + 2);
  if ((_List_node_base *)*plVar17 == p_Var20) {
    local_1d8._M_next = p_Var20->_M_next;
    local_1d8._M_prev = (_List_node_base *)plVar17[3];
  }
  else {
    local_1d8._M_next = p_Var20->_M_next;
    local_1e8._M_next = (_List_node_base *)*plVar17;
  }
  local_1e8._M_prev = (_List_node_base *)plVar17[1];
  *plVar17 = (long)p_Var20;
  plVar17[1] = 0;
  *(undefined1 *)&p_Var20->_M_next = 0;
  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1e8);
  local_128 = (BRDPoint)&local_118;
  BVar22 = (BRDPoint)(pBVar18 + 2);
  if (*pBVar18 == BVar22) {
    local_118 = *(ulong *)BVar22;
    BStack_110 = pBVar18[3];
  }
  else {
    local_118 = *(ulong *)BVar22;
    local_128 = *pBVar18;
  }
  BStack_120 = pBVar18[1];
  *pBVar18 = BVar22;
  pBVar18[1].x = 0;
  pBVar18[1].y = 0;
  *(undefined1 *)&pBVar18[2].x = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_208.p = (char **)&local_208.arena;
  plVar23 = plVar17 + 2;
  if ((char ***)*plVar17 == (char ***)plVar23) {
    local_208.arena = (char **)*plVar23;
    local_208.arena_end = (char **)plVar17[3];
  }
  else {
    local_208.arena = (char **)*plVar23;
    local_208.p = (char **)*plVar17;
  }
  local_208.s = (char **)plVar17[1];
  *plVar17 = (long)plVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  pBVar18 = (BRDPoint *)std::__cxx11::string::append((char *)&local_208);
  BVar22 = (BRDPoint)(pBVar18 + 2);
  if (*pBVar18 == BVar22) {
    local_158 = *(ulong *)BVar22;
    BStack_150 = pBVar18[3];
    local_168 = (undefined1  [8])&local_158;
  }
  else {
    local_158 = *(ulong *)BVar22;
    local_168 = (undefined1  [8])*pBVar18;
  }
  uStack_160 = pBVar18[1];
  *pBVar18 = BVar22;
  pBVar18[1].x = 0;
  pBVar18[1].y = 0;
  *(undefined1 *)&pBVar18[2].x = 0;
  plVar17 = (long *)std::__cxx11::string::append(local_168);
  psVar24 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar24) {
    local_d8 = *psVar24;
    aStack_d0._M_allocated_capacity = plVar17[3];
    local_e8 = (undefined1  [8])&local_d8;
  }
  else {
    local_d8 = *psVar24;
    local_e8 = (undefined1  [8])*plVar17;
  }
  local_e0._M_p = (pointer)plVar17[1];
  *plVar17 = (long)psVar24;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append(local_e8);
  plVar23 = plVar17 + 2;
  if ((long *)*plVar17 == plVar23) {
    local_88 = *plVar23;
    auStack_80[0] = plVar17[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar23;
    local_98 = (long *)*plVar17;
  }
  local_90 = (ulong *)plVar17[1];
  *plVar17 = (long)plVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  psVar2 = &(local_180->super_BRDFileBase).error_msg;
  std::__cxx11::string::operator=((string *)psVar2,(string *)&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_e8 != (undefined1  [8])&local_d8) {
    operator_delete((void *)local_e8,local_d8 + 1);
  }
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,local_158 + 1);
  }
  if ((char ***)local_208.p != &local_208.arena) {
    operator_delete(local_208.p,(long)local_208.arena + 1);
  }
  if (local_128 != (BRDPoint)&local_118) {
    operator_delete((void *)local_128,local_118 + 1);
  }
  if (local_1e8._M_next != &local_1d8) {
    operator_delete(local_1e8._M_next,(ulong)((long)&(local_1d8._M_next)->_M_next + 1));
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,(long)local_1b8[0] + 1);
  }
  if ((pointer *)
      local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage) {
    operator_delete(local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  SDL_LogError(1,"%s",(psVar2->_M_dataplus)._M_p);
  return;
}

Assistant:

BVR3File::BVR3File(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	BRDPart blank_part;
	BRDPin blank_pin;
	BRDPart part;
	BRDPin pin;
	std::list<std::pair<BRDPoint, BRDPoint>> outline_segments;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (!strncmp(line, "PART_NAME ", 10)) {
			p += 10;
			part.name = READ_STR();
		} else if (!strncmp(line, "PART_SIDE ", 10)) {
			p += 10;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				part.mounting_side = BRDPartMountingSide::Top;
			else if (!strcmp(side, "B"))
				part.mounting_side = BRDPartMountingSide::Bottom;
			else if (!strcmp(side, "O"))
				part.mounting_side = BRDPartMountingSide::Both;
		} else if (!strncmp(line, "PART_ORIGIN ", 12)) {
			// Value ignored, used as reference point for relative pin placements, not currently supported
		} else if (!strncmp(line, "PART_MOUNT ", 11)) {
			p += 11;
			char *mount = READ_STR();
			if (!strcmp(mount, "SMD"))
				part.part_type = BRDPartType::SMD;
			else
				part.part_type = BRDPartType::ThroughHole;
		} else if (!strncmp(line, "PART_OUTLINE_RELATIVE ", 22)) {
			// Value ignored, custom outline for parts not yet supported
		} else if (!strncmp(line, "PIN_ID ", 7)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_NUMBER ", 11)) {
			p += 11;
			pin.snum = READ_STR();
		} else if (!strncmp(line, "PIN_NAME ", 9)) {
			p += 9;
			pin.name = READ_STR();
		} else if (!strncmp(line, "PIN_SIDE ", 9)) {
			p += 9;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				pin.side = BRDPinSide::Top;
			else if (!strcmp(side, "B"))
				pin.side = BRDPinSide::Bottom;
			else if (!strcmp(side, "O"))
				pin.side = BRDPinSide::Both;
		} else if (!strncmp(line, "PIN_ORIGIN ", 11)) {
			p += 11;
			double origin_x = READ_DOUBLE();
			pin.pos.x = trunc(origin_x);
			double origin_y = READ_DOUBLE();
			pin.pos.y = trunc(origin_y);
		} else if (!strncmp(line, "PIN_RADIUS ", 11)) {
			p += 11;
			pin.radius = READ_DOUBLE();
		} else if (!strncmp(line, "PIN_NET ", 8)) {
			p += 8;
			pin.net = READ_STR();
		} else if (!strncmp(line, "PIN_TYPE ", 9)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_COMMENT ", 12)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_OUTLINE_RELATIVE ", 21)) {
			// Value ignored, custom outline for pins not yet supported
		} else if (!strcmp(line, "PIN_END")) {
			pin.part = parts.size() + 1; // pin is for current part, which will not yet have been added to parts vector
			pins.push_back(pin);
			pin = blank_pin;
		} else if (!strcmp(line, "PART_END")) {
			part.end_of_pins = pins.size();
			parts.push_back(part);
			part = blank_part;
		} else if (!strncmp(line, "OUTLINE_POINTS ", 15)) {
			p += 15;
			while (p[0]) {
				auto pold = p;
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x);
				double y = READ_DOUBLE();
				point.y  = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				format.push_back(point);
			}
		} else if (!strncmp(line, "OUTLINE_SEGMENTED ", 18)) {
			p += 18;
			while (p[0]) {
				auto pold = p;
				std::pair<BRDPoint, BRDPoint> outline_segment;
				double x = READ_DOUBLE();
				outline_segment.first.x  = trunc(x);
				double y = READ_DOUBLE();
				outline_segment.first.y  = trunc(y);
				x = READ_DOUBLE();
				outline_segment.second.x = trunc(x);
				y = READ_DOUBLE();
				outline_segment.second.y = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				outline_segments.push_back(outline_segment);
			}

			if (outline_segments.empty())
				continue;

			// Get first segment and add both points to format
			auto first_outline_segment = outline_segments.front();
			outline_segments.pop_front();
			format.push_back(first_outline_segment.first);
			format.push_back(first_outline_segment.second);

			// Loop through remaining segments picking the best candidate for the next segment
			BRDPoint start_point = first_outline_segment.first;
			BRDPoint end_point = first_outline_segment.second;
			while (start_point != end_point && !outline_segments.empty()) {
				// Loop through segments checking for exact match between points
				auto it = outline_segments.begin();
				bool match_found = false;
				while (it != outline_segments.end()) {
					// If exact match found on either first or second point, add other point to format and remove segment
					if (end_point == it->first) {
						format.push_back(it->second);
						end_point = it->second;
						outline_segments.erase(it);
						match_found = true;
						break;
					} else if (end_point == it->second) {
						format.push_back(it->first);
						end_point = it->first;
						outline_segments.erase(it);
						match_found = true;
						break;
					}
					it++;
				}
				if (match_found)
					continue;

				// Exact match not found, so pick nearest segment instead
				it = std::min_element(
					outline_segments.begin(),
					outline_segments.end(),
					[&end_point](const std::pair<BRDPoint, BRDPoint> &os1, const std::pair<BRDPoint, BRDPoint> &os2) {
						return std::min(manhattan_distance(end_point, os1.first), manhattan_distance(end_point, os1.second))
							< std::min(manhattan_distance(end_point, os2.first), manhattan_distance(end_point, os2.second));
					});

				// Calculate distances for comparison
				auto start_point_distance = manhattan_distance(end_point, start_point);
				auto segment_distance_first = manhattan_distance(end_point, it->first);
				auto segment_distance_second = manhattan_distance(end_point, it->second);

				// If start point is closer than both nearest segment points, format path more likely to be complete
				if (start_point_distance <= segment_distance_first && start_point_distance <= segment_distance_second) {
					format.push_back(start_point);
					end_point = start_point;
					break;
				}

				// Otherwise add points from nearest segment to format with closest point first, then remove segment
				if (segment_distance_first <= segment_distance_second) {
					format.push_back(it->first);
					format.push_back(it->second);
					end_point = it->second;
					outline_segments.erase(it);
				} else {
					format.push_back(it->second);
					format.push_back(it->first);
					end_point = it->first;
					outline_segments.erase(it);
				}
			}
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = num_parts > 0 || num_format > 0;
}